

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_fdopen.c
# Opt level: O0

zip_t * zip_fdopen(int fd_orig,int _flags,int *zep)

{
  int __fd;
  FILE *__stream;
  undefined1 local_50 [8];
  zip_error error;
  zip_source_t *src;
  zip_t *za;
  FILE *fp;
  int fd;
  int *zep_local;
  int _flags_local;
  int fd_orig_local;
  
  if ((_flags < 0) || ((_flags & 0xffffffebU) != 0)) {
    _zip_set_open_error(zep,(zip_error_t *)0x0,0x12);
    __flags_local = (zip_t *)0x0;
  }
  else {
    __fd = dup(fd_orig);
    if (__fd < 0) {
      _zip_set_open_error(zep,(zip_error_t *)0x0,0xb);
      __flags_local = (zip_t *)0x0;
    }
    else {
      __stream = fdopen(__fd,"rb");
      if (__stream == (FILE *)0x0) {
        close(__fd);
        _zip_set_open_error(zep,(zip_error_t *)0x0,0xb);
        __flags_local = (zip_t *)0x0;
      }
      else {
        zip_error_init((zip_error_t *)local_50);
        error.str = (char *)zip_source_filep_create((FILE *)__stream,0,-1,(zip_error_t *)local_50);
        if ((zip_source_t *)error.str == (zip_source_t *)0x0) {
          fclose(__stream);
          _zip_set_open_error(zep,(zip_error_t *)local_50,0);
          zip_error_fini((zip_error_t *)local_50);
          __flags_local = (zip_t *)0x0;
        }
        else {
          __flags_local =
               zip_open_from_source((zip_source_t *)error.str,_flags,(zip_error_t *)local_50);
          if (__flags_local == (zip_t *)0x0) {
            zip_source_free((zip_source_t *)error.str);
            _zip_set_open_error(zep,(zip_error_t *)local_50,0);
            zip_error_fini((zip_error_t *)local_50);
            __flags_local = (zip_t *)0x0;
          }
          else {
            zip_error_fini((zip_error_t *)local_50);
            close(fd_orig);
          }
        }
      }
    }
  }
  return __flags_local;
}

Assistant:

ZIP_EXTERN zip_t *
zip_fdopen(int fd_orig, int _flags, int *zep) {
    int fd;
    FILE *fp;
    zip_t *za;
    zip_source_t *src;
    struct zip_error error;

    if (_flags < 0 || (_flags & ~(ZIP_CHECKCONS | ZIP_RDONLY))) {
        _zip_set_open_error(zep, NULL, ZIP_ER_INVAL);
        return NULL;
    }

#ifndef ENABLE_FDOPEN
    _zip_set_open_error(zep, NULL, ZIP_ER_OPNOTSUPP);
    return NULL;
#else
    /* We dup() here to avoid messing with the passed in fd.
       We could not restore it to the original state in case of error. */

    if ((fd = dup(fd_orig)) < 0) {
        _zip_set_open_error(zep, NULL, ZIP_ER_OPEN);
        return NULL;
    }

    if ((fp = fdopen(fd, "rb")) == NULL) {
        close(fd);
        _zip_set_open_error(zep, NULL, ZIP_ER_OPEN);
        return NULL;
    }

    zip_error_init(&error);
    if ((src = zip_source_filep_create(fp, 0, -1, &error)) == NULL) {
        fclose(fp);
        _zip_set_open_error(zep, &error, 0);
        zip_error_fini(&error);
        return NULL;
    }

    if ((za = zip_open_from_source(src, _flags, &error)) == NULL) {
        zip_source_free(src);
        _zip_set_open_error(zep, &error, 0);
        zip_error_fini(&error);
        return NULL;
    }

    zip_error_fini(&error);
    close(fd_orig);
    return za;
#endif
}